

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall
FxCompareEq::EmitCompare
          (FxCompareEq *this,VMFunctionBuilder *build,bool invert,
          TArray<unsigned_long,_unsigned_long> *patchspots_yes,
          TArray<unsigned_long,_unsigned_long> *patchspots_no)

{
  size_t local_20;
  ExpEmit emit;
  
  emit = EmitCommon(this,build,true,invert);
  ExpEmit::Free(&emit,build);
  local_20 = VMFunctionBuilder::Emit(build,0x44,0);
  TArray<unsigned_long,_unsigned_long>::Push(patchspots_no,&local_20);
  return;
}

Assistant:

void FxCompareEq::EmitCompare(VMFunctionBuilder *build, bool invert, TArray<size_t> &patchspots_yes, TArray<size_t> &patchspots_no)
{
	ExpEmit emit = EmitCommon(build, true, invert);
	emit.Free(build);
	patchspots_no.Push(build->Emit(OP_JMP, 0));
}